

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

void uprv_parseCurrency_63
               (char *locale,UnicodeString *text,ParsePosition *pos,int8_t type,
               int32_t *partialMatchLen,UChar *result,UErrorCode *ec)

{
  short sVar1;
  CurrencyNameStruct *pCVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  CurrencyNameStruct *pCVar6;
  int32_t matchIndexInSymbol;
  int32_t maxInSymbol;
  int32_t matchIndex;
  int32_t max;
  UErrorCode ec1;
  UChar inputText [100];
  UChar upperText [100];
  int32_t local_224;
  int32_t local_220;
  int local_21c;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  CurrencyNameStruct *local_208;
  ParsePosition *local_200;
  CurrencyNameStruct *local_1f8;
  CurrencyNameCacheEntry *local_1f0;
  UChar *local_1e8;
  UChar *local_1e0;
  UErrorCode local_1cc;
  UChar local_1c8 [104];
  UChar local_f8 [100];
  
  if ((*ec < U_ILLEGAL_ARGUMENT_ERROR) &&
     (local_1e8 = result, local_1f0 = getCacheEntry(locale,ec), *ec < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_21c = pos->index;
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    local_218 = local_1f0->totalCurrencyNameCount;
    local_208 = local_1f0->currencyNames;
    local_220 = local_1f0->totalCurrencySymbolCount;
    local_1f8 = local_1f0->currencySymbols;
    iVar3 = 100;
    if (iVar5 - local_21c < 100) {
      iVar3 = iVar5 - local_21c;
    }
    local_200 = pos;
    icu_63::UnicodeString::doExtract(text,local_21c,iVar3,local_1c8,0);
    local_1cc = U_ZERO_ERROR;
    local_1e0 = local_1c8;
    iVar3 = u_strToUpper_63(local_f8,100,local_1c8,iVar3,locale,&local_1cc);
    *partialMatchLen = 0;
    local_20c = 0;
    local_210 = -1;
    searchCurrencyName(local_208,local_218,local_f8,iVar3,partialMatchLen,&local_20c,&local_210);
    pCVar2 = local_1f8;
    local_214 = 0;
    local_224 = -1;
    if (type != '\x01') {
      searchCurrencyName(local_1f8,local_220,local_1c8,iVar3,partialMatchLen,&local_214,&local_224);
    }
    pCVar6 = local_208;
    iVar3 = local_20c;
    iVar4 = local_210;
    if ((local_214 <= local_20c && local_210 != -1) ||
       (pCVar6 = pCVar2, iVar3 = local_214, iVar4 = local_224,
       local_224 != -1 && local_20c <= local_214)) {
      u_charsToUChars_63(pCVar6[iVar4].IsoCode,local_1e8,4);
      local_200->index = iVar3 + local_21c;
    }
    releaseCacheEntry(local_1f0);
  }
  return;
}

Assistant:

U_CAPI void
uprv_parseCurrency(const char* locale,
                   const icu::UnicodeString& text,
                   icu::ParsePosition& pos,
                   int8_t type,
                   int32_t* partialMatchLen,
                   UChar* result,
                   UErrorCode& ec) {
    U_NAMESPACE_USE
    if (U_FAILURE(ec)) {
        return;
    }
    CurrencyNameCacheEntry* cacheEntry = getCacheEntry(locale, ec);
    if (U_FAILURE(ec)) {
        return;
    }

    int32_t total_currency_name_count = cacheEntry->totalCurrencyNameCount;
    CurrencyNameStruct* currencyNames = cacheEntry->currencyNames;
    int32_t total_currency_symbol_count = cacheEntry->totalCurrencySymbolCount;
    CurrencyNameStruct* currencySymbols = cacheEntry->currencySymbols;

    int32_t start = pos.getIndex();

    UChar inputText[MAX_CURRENCY_NAME_LEN];  
    UChar upperText[MAX_CURRENCY_NAME_LEN];  
    int32_t textLen = MIN(MAX_CURRENCY_NAME_LEN, text.length() - start);
    text.extract(start, textLen, inputText);
    UErrorCode ec1 = U_ZERO_ERROR;
    textLen = u_strToUpper(upperText, MAX_CURRENCY_NAME_LEN, inputText, textLen, locale, &ec1);

    // Make sure partialMatchLen is initialized
    *partialMatchLen = 0;

    int32_t max = 0;
    int32_t matchIndex = -1;
    // case in-sensitive comparision against currency names
    searchCurrencyName(currencyNames, total_currency_name_count, 
                       upperText, textLen, partialMatchLen, &max, &matchIndex);

#ifdef UCURR_DEBUG
    printf("search in names, max = %d, matchIndex = %d\n", max, matchIndex);
#endif

    int32_t maxInSymbol = 0;
    int32_t matchIndexInSymbol = -1;
    if (type != UCURR_LONG_NAME) {  // not name only
        // case sensitive comparison against currency symbols and ISO code.
        searchCurrencyName(currencySymbols, total_currency_symbol_count, 
                           inputText, textLen,
                           partialMatchLen,
                           &maxInSymbol, &matchIndexInSymbol);
    }

#ifdef UCURR_DEBUG
    printf("search in symbols, maxInSymbol = %d, matchIndexInSymbol = %d\n", maxInSymbol, matchIndexInSymbol);
    if(matchIndexInSymbol != -1) {
      printf("== ISO=%s\n", currencySymbols[matchIndexInSymbol].IsoCode);
    }
#endif

    if (max >= maxInSymbol && matchIndex != -1) {
        u_charsToUChars(currencyNames[matchIndex].IsoCode, result, 4);
        pos.setIndex(start + max);
    } else if (maxInSymbol >= max && matchIndexInSymbol != -1) {
        u_charsToUChars(currencySymbols[matchIndexInSymbol].IsoCode, result, 4);
        pos.setIndex(start + maxInSymbol);
    }

    // decrease reference count
    releaseCacheEntry(cacheEntry);
}